

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O3

ostream * lf::base::operator<<(ostream *stream,RefEl *ref_el)

{
  ostream *poVar1;
  string local_30;
  
  RefEl::ToString_abi_cxx11_(&local_30,ref_el);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, const RefEl& ref_el) {
  return stream << ref_el.ToString();
}